

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O3

void renderBack(void)

{
  (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[0]);
  (*glad_glBindFramebuffer)(0x8ca9,0);
  (*glad_glBlitFramebuffer)
            (0,0,g_app.viewer.w,g_app.viewer.h,0,0,g_app.viewer.w,g_app.viewer.h,0x4000,0x2600);
  return;
}

Assistant:

void renderBack()
{
    glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);

    // blit scene framebuffer
    glBlitFramebuffer(0, 0, g_app.viewer.w, g_app.viewer.h,
                      0, 0, g_app.viewer.w, g_app.viewer.h,
                      GL_COLOR_BUFFER_BIT,
                      GL_NEAREST);
}